

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall tonk::ReceiverStatistics::Decompress(ReceiverStatistics *this,uint8_t *buffer)

{
  uint8_t *buffer_local;
  ReceiverStatistics *this_local;
  
  this->LossRate = (float)*buffer / 256.0;
  this->GoodputBPS = (*(ushort *)(buffer + 1) & 0x7ff) << (byte)(*(ushort *)(buffer + 1) >> 0xb);
  this->TripUsec = (*(ushort *)(buffer + 3) & 0x7ff) << (byte)(*(ushort *)(buffer + 3) >> 0xb);
  return;
}

Assistant:

void ReceiverStatistics::Decompress(const uint8_t* buffer)
{
    LossRate = static_cast<int>(buffer[0]) / 256.f;
    GoodputBPS = FixedPointDecompress16to32(siamese::ReadU16_LE(buffer + 1));
    TripUsec = FixedPointDecompress16to32(siamese::ReadU16_LE(buffer + 3));
}